

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamTaperedTimoshenko.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementBeamTaperedTimoshenko::GetField_dtdt
          (ChElementBeamTaperedTimoshenko *this,ChVectorDynamic<> *mD_dtdt)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  element_type *peVar6;
  double *pdVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  uint uVar10;
  void *pvVar11;
  undefined8 *puVar12;
  double *pdVar13;
  uint uVar14;
  ulong uVar15;
  undefined1 auVar16 [16];
  double dVar17;
  double dVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  ulong local_38;
  double local_30;
  ulong local_28;
  
  if ((mD_dtdt->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows !=
      0xc) {
    pdVar13 = (mD_dtdt->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
              m_data;
    if (pdVar13 != (double *)0x0) {
      free((void *)pdVar13[-1]);
    }
    pvVar11 = malloc(0xa0);
    if (pvVar11 == (void *)0x0) {
      pdVar13 = (double *)0x0;
    }
    else {
      *(void **)(((ulong)pvVar11 & 0xffffffffffffffc0) + 0x38) = pvVar11;
      pdVar13 = (double *)(((ulong)pvVar11 & 0xffffffffffffffc0) + 0x40);
    }
    if (pdVar13 == (double *)0x0) {
      puVar12 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar12 = std::ostream::_M_insert<bool>;
      __cxa_throw(puVar12,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    (mD_dtdt->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data =
         pdVar13;
  }
  (mD_dtdt->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows = 0xc;
  peVar6 = (((this->nodes).
             super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
           super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  dVar1 = (this->q_element_abs_rot).m_data[0];
  auVar19._8_8_ = 0;
  auVar19._0_8_ = dVar1;
  dVar1 = dVar1 * dVar1;
  dVar2 = (this->q_element_abs_rot).m_data[1];
  dVar3 = (this->q_element_abs_rot).m_data[2];
  dVar4 = (this->q_element_abs_rot).m_data[3];
  auVar16._8_8_ = 0x8000000000000000;
  auVar16._0_8_ = 0x8000000000000000;
  auVar16 = vxorpd_avx512vl(auVar19,auVar16);
  dVar17 = auVar16._0_8_;
  auVar71 = ZEXT816(0xbff0000000000000);
  auVar22 = ZEXT816(0x4000000000000000);
  auVar39._8_8_ = 0;
  auVar39._0_8_ = dVar1 + dVar2 * dVar2;
  auVar16 = vfmadd213sd_fma(auVar39,auVar22,auVar71);
  dVar18 = dVar2 * dVar3 - dVar4 * dVar17;
  auVar63._8_8_ = 0;
  auVar63._0_8_ = *(ulong *)&peVar6->field_0xd8;
  dVar5 = *(double *)&peVar6->field_0xe0;
  auVar59._8_8_ = 0;
  auVar59._0_8_ = dVar5 * (dVar18 + dVar18);
  auVar16 = vfmadd231sd_fma(auVar59,auVar63,auVar16);
  dVar18 = dVar3 * dVar17 + dVar2 * dVar4;
  auVar67._8_8_ = 0;
  auVar67._0_8_ = *(ulong *)&peVar6->field_0xe8;
  auVar40._8_8_ = 0;
  auVar40._0_8_ = dVar18 + dVar18;
  auVar16 = vfmadd213sd_fma(auVar40,auVar67,auVar16);
  dVar18 = dVar2 * dVar3 + dVar4 * dVar17;
  auVar51._8_8_ = 0;
  auVar51._0_8_ = dVar1 + dVar3 * dVar3;
  auVar19 = vfmadd213sd_fma(auVar51,auVar22,auVar71);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = dVar18 + dVar18;
  auVar52._8_8_ = 0;
  auVar52._0_8_ = dVar5 * auVar19._0_8_;
  auVar19 = vfmadd231sd_fma(auVar52,auVar63,auVar20);
  dVar18 = dVar3 * dVar4 - dVar2 * dVar17;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = dVar18 + dVar18;
  auVar19 = vfmadd213sd_fma(auVar21,auVar67,auVar19);
  dVar18 = dVar2 * dVar4 - dVar3 * dVar17;
  dVar2 = dVar2 * dVar17 + dVar3 * dVar4;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = dVar18 + dVar18;
  auVar47._8_8_ = 0;
  auVar47._0_8_ = dVar5 * (dVar2 + dVar2);
  auVar21 = vfmadd231sd_fma(auVar47,auVar63,auVar37);
  auVar31._8_8_ = 0;
  auVar31._0_8_ = dVar1 + dVar4 * dVar4;
  auVar20 = vfmadd213sd_fma(auVar31,auVar22,auVar71);
  auVar20 = vfmadd213sd_fma(auVar20,auVar67,auVar21);
  local_50 = auVar16._0_8_;
  local_48 = auVar19._0_8_;
  local_40 = auVar20._0_8_;
  pdVar13 = (mD_dtdt->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
            m_data;
  uVar14 = 3;
  if ((((ulong)pdVar13 & 7) == 0) &&
     (uVar10 = -((uint)((ulong)pdVar13 >> 3) & 0x1fffffff) & 7, uVar10 < 3)) {
    uVar14 = uVar10;
  }
  if (uVar14 != 0) {
    memcpy(pdVar13,&local_50,(ulong)(uVar14 * 8));
  }
  if (uVar14 < 3) {
    uVar15 = (ulong)(uVar14 << 3);
    memcpy((void *)((long)pdVar13 + uVar15),(void *)((long)&local_50 + uVar15),0x18 - uVar15);
  }
  ChFrameMoving<double>::GetWacc_par
            ((ChFrameMoving<double> *)
             ((long)&((((this->nodes).
                        super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr)->super_ChNodeFEAbase + 0x18));
  dVar1 = (this->q_element_abs_rot).m_data[0];
  auVar22._8_8_ = 0;
  auVar22._0_8_ = dVar1;
  dVar2 = (this->q_element_abs_rot).m_data[1];
  dVar1 = dVar1 * dVar1;
  dVar3 = (this->q_element_abs_rot).m_data[2];
  dVar4 = (this->q_element_abs_rot).m_data[3];
  auVar71._8_8_ = 0x8000000000000000;
  auVar71._0_8_ = 0x8000000000000000;
  auVar16 = vxorpd_avx512vl(auVar22,auVar71);
  dVar18 = auVar16._0_8_;
  auVar20 = ZEXT816(0xbff0000000000000);
  auVar31 = ZEXT816(0x4000000000000000);
  auVar41._8_8_ = 0;
  auVar41._0_8_ = dVar1 + dVar2 * dVar2;
  auVar16 = vfmadd213sd_fma(auVar41,auVar31,auVar20);
  dVar5 = dVar2 * dVar3 - dVar4 * dVar18;
  auVar64._8_8_ = 0;
  auVar64._0_8_ = local_38;
  auVar60._8_8_ = 0;
  auVar60._0_8_ = local_30 * (dVar5 + dVar5);
  auVar16 = vfmadd231sd_fma(auVar60,auVar64,auVar16);
  dVar5 = dVar3 * dVar18 + dVar2 * dVar4;
  auVar68._8_8_ = 0;
  auVar68._0_8_ = local_28;
  auVar42._8_8_ = 0;
  auVar42._0_8_ = dVar5 + dVar5;
  auVar16 = vfmadd213sd_fma(auVar42,auVar68,auVar16);
  dVar5 = dVar2 * dVar3 + dVar4 * dVar18;
  auVar53._8_8_ = 0;
  auVar53._0_8_ = dVar1 + dVar3 * dVar3;
  auVar19 = vfmadd213sd_fma(auVar53,auVar31,auVar20);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = dVar5 + dVar5;
  auVar54._8_8_ = 0;
  auVar54._0_8_ = local_30 * auVar19._0_8_;
  auVar19 = vfmadd231sd_fma(auVar54,auVar64,auVar23);
  dVar5 = dVar3 * dVar4 - dVar2 * dVar18;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = dVar5 + dVar5;
  auVar19 = vfmadd213sd_fma(auVar24,auVar68,auVar19);
  dVar5 = dVar2 * dVar4 - dVar3 * dVar18;
  dVar2 = dVar2 * dVar18 + dVar3 * dVar4;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = dVar5 + dVar5;
  auVar48._8_8_ = 0;
  auVar48._0_8_ = local_30 * (dVar2 + dVar2);
  auVar21 = vfmadd231sd_fma(auVar48,auVar64,auVar32);
  auVar33._8_8_ = 0;
  auVar33._0_8_ = dVar1 + dVar4 * dVar4;
  auVar20 = vfmadd213sd_fma(auVar33,auVar31,auVar20);
  auVar20 = vfmadd213sd_fma(auVar20,auVar68,auVar21);
  local_50 = auVar16._0_8_;
  local_48 = auVar19._0_8_;
  local_40 = auVar20._0_8_;
  if (5 < (mD_dtdt->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
     ) {
    pdVar7 = (mD_dtdt->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data;
    pdVar13 = pdVar7 + 3;
    uVar14 = 3;
    if ((((ulong)pdVar13 & 7) == 0) &&
       (uVar10 = -((uint)((ulong)pdVar13 >> 3) & 0x1fffffff) & 7, uVar10 < 3)) {
      uVar14 = uVar10;
    }
    if (uVar14 != 0) {
      memcpy(pdVar13,&local_50,(ulong)(uVar14 * 8));
    }
    if (uVar14 < 3) {
      uVar15 = (ulong)(uVar14 << 3);
      memcpy((void *)((long)pdVar7 + uVar15 + 0x18),(void *)((long)&local_50 + uVar15),0x18 - uVar15
            );
    }
    peVar6 = (this->nodes).
             super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
             ._M_impl.super__Vector_impl_data._M_start[1].
             super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    dVar1 = (this->q_element_abs_rot).m_data[0];
    auVar25._8_8_ = 0;
    auVar25._0_8_ = dVar1;
    dVar1 = dVar1 * dVar1;
    dVar2 = (this->q_element_abs_rot).m_data[1];
    dVar3 = (this->q_element_abs_rot).m_data[2];
    dVar4 = (this->q_element_abs_rot).m_data[3];
    auVar8._8_8_ = 0x8000000000000000;
    auVar8._0_8_ = 0x8000000000000000;
    auVar16 = vxorpd_avx512vl(auVar25,auVar8);
    dVar17 = auVar16._0_8_;
    auVar20 = ZEXT816(0xbff0000000000000);
    auVar31 = ZEXT816(0x4000000000000000);
    auVar43._8_8_ = 0;
    auVar43._0_8_ = dVar1 + dVar2 * dVar2;
    auVar16 = vfmadd213sd_fma(auVar43,auVar31,auVar20);
    dVar18 = dVar2 * dVar3 - dVar4 * dVar17;
    auVar65._8_8_ = 0;
    auVar65._0_8_ = *(ulong *)&peVar6->field_0xd8;
    dVar5 = *(double *)&peVar6->field_0xe0;
    auVar61._8_8_ = 0;
    auVar61._0_8_ = dVar5 * (dVar18 + dVar18);
    auVar16 = vfmadd231sd_fma(auVar61,auVar65,auVar16);
    dVar18 = dVar3 * dVar17 + dVar2 * dVar4;
    auVar69._8_8_ = 0;
    auVar69._0_8_ = *(ulong *)&peVar6->field_0xe8;
    auVar44._8_8_ = 0;
    auVar44._0_8_ = dVar18 + dVar18;
    auVar16 = vfmadd213sd_fma(auVar44,auVar69,auVar16);
    dVar18 = dVar2 * dVar3 + dVar4 * dVar17;
    auVar55._8_8_ = 0;
    auVar55._0_8_ = dVar1 + dVar3 * dVar3;
    auVar19 = vfmadd213sd_fma(auVar55,auVar31,auVar20);
    auVar26._8_8_ = 0;
    auVar26._0_8_ = dVar18 + dVar18;
    auVar56._8_8_ = 0;
    auVar56._0_8_ = dVar5 * auVar19._0_8_;
    auVar19 = vfmadd231sd_fma(auVar56,auVar65,auVar26);
    dVar18 = dVar3 * dVar4 - dVar2 * dVar17;
    auVar27._8_8_ = 0;
    auVar27._0_8_ = dVar18 + dVar18;
    auVar19 = vfmadd213sd_fma(auVar27,auVar69,auVar19);
    dVar18 = dVar2 * dVar4 - dVar3 * dVar17;
    dVar2 = dVar2 * dVar17 + dVar3 * dVar4;
    auVar38._8_8_ = 0;
    auVar38._0_8_ = dVar18 + dVar18;
    auVar49._8_8_ = 0;
    auVar49._0_8_ = dVar5 * (dVar2 + dVar2);
    auVar21 = vfmadd231sd_fma(auVar49,auVar65,auVar38);
    auVar34._8_8_ = 0;
    auVar34._0_8_ = dVar1 + dVar4 * dVar4;
    auVar20 = vfmadd213sd_fma(auVar34,auVar31,auVar20);
    auVar20 = vfmadd213sd_fma(auVar20,auVar69,auVar21);
    local_50 = auVar16._0_8_;
    local_48 = auVar19._0_8_;
    local_40 = auVar20._0_8_;
    if (8 < (mD_dtdt->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
            m_rows) {
      pdVar7 = (mD_dtdt->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
               m_data;
      pdVar13 = pdVar7 + 6;
      uVar14 = 3;
      if ((((ulong)pdVar13 & 7) == 0) &&
         (uVar10 = -((uint)((ulong)pdVar13 >> 3) & 0x1fffffff) & 7, uVar10 < 3)) {
        uVar14 = uVar10;
      }
      if (uVar14 != 0) {
        memcpy(pdVar13,&local_50,(ulong)(uVar14 * 8));
      }
      if (uVar14 < 3) {
        uVar15 = (ulong)(uVar14 << 3);
        memcpy((void *)((long)pdVar7 + uVar15 + 0x30),(void *)((long)&local_50 + uVar15),
               0x18 - uVar15);
      }
      ChFrameMoving<double>::GetWacc_par
                ((ChFrameMoving<double> *)
                 ((long)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[1].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr)->super_ChNodeFEAbase + 0x18));
      dVar1 = (this->q_element_abs_rot).m_data[0];
      auVar28._8_8_ = 0;
      auVar28._0_8_ = dVar1;
      dVar2 = (this->q_element_abs_rot).m_data[1];
      dVar1 = dVar1 * dVar1;
      dVar3 = (this->q_element_abs_rot).m_data[2];
      dVar4 = (this->q_element_abs_rot).m_data[3];
      auVar9._8_8_ = 0x8000000000000000;
      auVar9._0_8_ = 0x8000000000000000;
      auVar16 = vxorpd_avx512vl(auVar28,auVar9);
      dVar18 = auVar16._0_8_;
      auVar20 = ZEXT816(0xbff0000000000000);
      auVar31 = ZEXT816(0x4000000000000000);
      auVar45._8_8_ = 0;
      auVar45._0_8_ = dVar1 + dVar2 * dVar2;
      auVar16 = vfmadd213sd_fma(auVar45,auVar31,auVar20);
      dVar5 = dVar2 * dVar3 - dVar4 * dVar18;
      auVar66._8_8_ = 0;
      auVar66._0_8_ = local_38;
      auVar62._8_8_ = 0;
      auVar62._0_8_ = local_30 * (dVar5 + dVar5);
      auVar16 = vfmadd231sd_fma(auVar62,auVar66,auVar16);
      dVar5 = dVar3 * dVar18 + dVar2 * dVar4;
      auVar70._8_8_ = 0;
      auVar70._0_8_ = local_28;
      auVar46._8_8_ = 0;
      auVar46._0_8_ = dVar5 + dVar5;
      auVar16 = vfmadd213sd_fma(auVar46,auVar70,auVar16);
      dVar5 = dVar2 * dVar3 + dVar4 * dVar18;
      auVar57._8_8_ = 0;
      auVar57._0_8_ = dVar1 + dVar3 * dVar3;
      auVar19 = vfmadd213sd_fma(auVar57,auVar31,auVar20);
      auVar29._8_8_ = 0;
      auVar29._0_8_ = dVar5 + dVar5;
      auVar58._8_8_ = 0;
      auVar58._0_8_ = local_30 * auVar19._0_8_;
      auVar19 = vfmadd231sd_fma(auVar58,auVar66,auVar29);
      dVar5 = dVar3 * dVar4 - dVar2 * dVar18;
      auVar30._8_8_ = 0;
      auVar30._0_8_ = dVar5 + dVar5;
      auVar19 = vfmadd213sd_fma(auVar30,auVar70,auVar19);
      dVar5 = dVar2 * dVar4 - dVar3 * dVar18;
      dVar2 = dVar2 * dVar18 + dVar3 * dVar4;
      auVar35._8_8_ = 0;
      auVar35._0_8_ = dVar5 + dVar5;
      auVar50._8_8_ = 0;
      auVar50._0_8_ = local_30 * (dVar2 + dVar2);
      auVar21 = vfmadd231sd_fma(auVar50,auVar66,auVar35);
      auVar36._8_8_ = 0;
      auVar36._0_8_ = dVar1 + dVar4 * dVar4;
      auVar20 = vfmadd213sd_fma(auVar36,auVar31,auVar20);
      auVar20 = vfmadd213sd_fma(auVar20,auVar70,auVar21);
      local_50 = auVar16._0_8_;
      local_48 = auVar19._0_8_;
      local_40 = auVar20._0_8_;
      if (0xb < (mD_dtdt->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                m_rows) {
        pdVar7 = (mD_dtdt->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage
                 .m_data;
        pdVar13 = pdVar7 + 9;
        uVar14 = 3;
        if ((((ulong)pdVar13 & 7) == 0) &&
           (uVar10 = -((uint)((ulong)pdVar13 >> 3) & 0x1fffffff) & 7, uVar10 < 3)) {
          uVar14 = uVar10;
        }
        if (uVar14 != 0) {
          memcpy(pdVar13,&local_50,(ulong)(uVar14 * 8));
        }
        if (uVar14 < 3) {
          uVar15 = (ulong)(uVar14 << 3);
          memcpy((void *)((long)pdVar7 + uVar15 + 0x48),(void *)((long)&local_50 + uVar15),
                 0x18 - uVar15);
        }
        return;
      }
    }
  }
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
               );
}

Assistant:

void ChElementBeamTaperedTimoshenko::GetField_dtdt(ChVectorDynamic<>& mD_dtdt) {
    mD_dtdt.resize(12);

    // Node 0, accelaration (in local element frame, corotated back by A' )
    mD_dtdt.segment(0, 3) = q_element_abs_rot.RotateBack(nodes[0]->Frame().GetPos_dtdt()).eigen();

    // Node 0, x,y,z ang.accelaration (in local element frame, corotated back by A' )
    mD_dtdt.segment(3, 3) = q_element_abs_rot.RotateBack(nodes[0]->Frame().GetWacc_par()).eigen();

    // Node 1, accelaration (in local element frame, corotated back by A' )
    mD_dtdt.segment(6, 3) = q_element_abs_rot.RotateBack(nodes[1]->Frame().GetPos_dtdt()).eigen();

    // Node 1, x,y,z ang.accelaration (in local element frame, corotated back by A' )
    mD_dtdt.segment(9, 3) = q_element_abs_rot.RotateBack(nodes[1]->Frame().GetWacc_par()).eigen();
}